

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::ExtrasError::~ExtrasError(ExtrasError *this)

{
  ExtrasError *this_local;
  
  ~ExtrasError(this);
  operator_delete(this);
  return;
}

Assistant:

ExtrasError(std::vector<std::string> args)
        : ExtrasError((args.size() > 1 ? "The following arguments were not expected: "
                                       : "The following argument was not expected: ") +
                          detail::rjoin(args, " "),
                      ExitCodes::ExtrasError) {}